

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O2

int PixarLogDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  long lVar1;
  short *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  uint8_t *puVar9;
  long lVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  unkbyte10 Var29;
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  undefined1 *puVar39;
  uint uVar40;
  char *pcVar41;
  ushort *puVar42;
  ulong *puVar43;
  uint uVar44;
  long lVar45;
  ushort uVar46;
  uint uVar47;
  uint uVar48;
  long lVar49;
  ushort uVar50;
  ulong uVar51;
  long lVar52;
  ushort uVar53;
  ulong uVar54;
  ushort *puVar55;
  long lVar56;
  ulong *wp;
  ulong uVar57;
  ulong uVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  
  puVar9 = tif->tif_data;
  uVar44 = *(uint *)(puVar9 + 0x108);
  if (uVar44 - 2 < 3) {
    occ = (ulong)occ >> 1;
  }
  else if (1 < uVar44) {
    if (uVar44 != 5) {
      uVar50 = (tif->tif_dir).td_bitspersample;
      pcVar41 = "%u bit input not supported in PixarLog";
LAB_0026784a:
      TIFFErrorExtR(tif,"PixarLogDecode",pcVar41,(ulong)uVar50);
      return 0;
    }
    occ = (ulong)occ >> 2;
  }
  uVar44 = (uint)*(ushort *)(puVar9 + 0x100) * (tif->tif_dir).td_imagewidth;
  *(uint8_t **)(puVar9 + 0x80) = tif->tif_rawcp;
  *(int *)(puVar9 + 0x88) = (int)tif->tif_rawcc;
  *(undefined8 *)(puVar9 + 0x98) = *(undefined8 *)(puVar9 + 0xf8);
  uVar51 = occ * 2;
  *(int *)(puVar9 + 0xa0) = (int)uVar51;
  if (uVar51 >> 0x20 == 0) {
    if ((long)uVar51 <= *(long *)(puVar9 + 0xf0)) {
      do {
        iVar36 = inflate((z_streamp)(puVar9 + 0x80),1);
        if (iVar36 != 0) {
          if (iVar36 != 1) {
            if (iVar36 == -3) {
              pcVar41 = "(null)";
              if (*(char **)(puVar9 + 0xb0) != (char *)0x0) {
                pcVar41 = *(char **)(puVar9 + 0xb0);
              }
              TIFFErrorExtR(tif,"PixarLogDecode","Decoding error at scanline %u, %s",
                            (ulong)tif->tif_row,pcVar41);
              return 0;
            }
            pcVar41 = "(null)";
            if (*(char **)(puVar9 + 0xb0) != (char *)0x0) {
              pcVar41 = *(char **)(puVar9 + 0xb0);
            }
            TIFFErrorExtR(tif,"PixarLogDecode","ZLib error: %s",pcVar41);
            return 0;
          }
          if (*(int *)(puVar9 + 0xa0) != 0) {
            TIFFErrorExtR(tif,"PixarLogDecode","Not enough data at scanline %u (short %u bytes)",
                          (ulong)tif->tif_row);
            return 0;
          }
          break;
        }
      } while (*(int *)(puVar9 + 0xa0) != 0);
      tif->tif_rawcp = *(uint8_t **)(puVar9 + 0x80);
      tif->tif_rawcc = (ulong)*(uint *)(puVar9 + 0x88);
      wp = *(ulong **)(puVar9 + 0xf8);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfShort((uint16_t *)wp,occ);
      }
      lVar49 = (long)(int)uVar44;
      if (occ % lVar49 != 0) {
        TIFFWarningExtR(tif,"PixarLogDecode",
                        "stride %d is not a multiple of sample count, %ld, data truncated.",
                        (ulong)uVar44,occ);
        occ = occ - occ % lVar49;
      }
      auVar34 = _DAT_002e9a90;
      auVar33 = _DAT_002e9a70;
      auVar32 = _DAT_002e9a50;
      lVar10 = lVar49 * 2;
      lVar1 = lVar49 * 4;
      puVar42 = (ushort *)((long)wp + 10);
      lVar45 = 0;
      do {
        if (occ <= lVar45) {
          return 1;
        }
        lVar52 = lVar49;
        switch(*(undefined4 *)(puVar9 + 0x108)) {
        case 0:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          if ((int)(uint)uVar50 <= (int)uVar44) {
            lVar56 = *(long *)(puVar9 + 0x130);
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              uVar54 = (ulong)(ushort)*wp & 0x7ff;
              *op = *(undefined1 *)(lVar56 + uVar54);
              uVar58 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
              *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar56 + uVar58);
              uVar51 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
              *(undefined1 *)((long)op + 2) = *(undefined1 *)(lVar56 + uVar51);
              lVar38 = 5;
              for (uVar47 = uVar44; 3 < (int)uVar47; uVar47 = uVar47 - 3) {
                uVar37 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38 * 2 + -4);
                uVar54 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38 + -2) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                uVar37 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 * 2 + -2);
                uVar58 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38 + -1) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38 * 2);
                uVar51 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                lVar38 = lVar38 + 3;
              }
            }
            else if (uVar47 == 4) {
              uVar58 = (ulong)(ushort)*wp & 0x7ff;
              *op = *(undefined1 *)(lVar56 + uVar58);
              uVar54 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
              *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar56 + uVar54);
              uVar57 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
              *(undefined1 *)((long)op + 2) = *(undefined1 *)(lVar56 + uVar57);
              uVar51 = (ulong)*(ushort *)((long)wp + 6) & 0x7ff;
              *(undefined1 *)((long)op + 3) = *(undefined1 *)(lVar56 + uVar51);
              lVar38 = 7;
              for (uVar47 = uVar44; 4 < (int)uVar47; uVar47 = uVar47 - 4) {
                uVar37 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 * 2 + -6);
                uVar58 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38 + -3) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                uVar37 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38 * 2 + -4);
                uVar54 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38 + -2) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                uVar37 = (int)uVar57 + (uint)*(ushort *)((long)wp + lVar38 * 2 + -2);
                uVar57 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38 + -1) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38 * 2);
                uVar51 = (ulong)uVar37;
                *(undefined1 *)((long)op + lVar38) =
                     *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                lVar38 = lVar38 + 4;
              }
            }
            else {
              puVar55 = (ushort *)op;
              puVar43 = wp;
              uVar37 = uVar50 + 1;
              do {
                *(undefined1 *)puVar55 = *(undefined1 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff))
                ;
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = (ushort *)((long)puVar55 + 1);
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  psVar2 = (short *)((long)puVar43 + (ulong)uVar47 * 2);
                  *psVar2 = *psVar2 + (short)*puVar43;
                  *(undefined1 *)puVar55 =
                       *(undefined1 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff));
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = (ushort *)((long)puVar55 + 1);
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        case 1:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          if ((int)(uint)uVar50 <= (int)uVar44) {
            lVar56 = *(long *)(puVar9 + 0x130);
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              *op = 0;
              uVar51 = (ulong)*(ushort *)((long)wp + 4) & 0x7ff;
              uVar54 = (ulong)*(ushort *)((long)wp + 2) & 0x7ff;
              uVar6 = *(undefined1 *)(lVar56 + uVar54);
              uVar58 = (ulong)(ushort)*wp & 0x7ff;
              uVar7 = *(undefined1 *)(lVar56 + uVar58);
              *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar56 + uVar51);
              *(undefined1 *)((long)op + 2) = uVar6;
              *(undefined1 *)((long)op + 3) = uVar7;
              puVar39 = (undefined1 *)((long)op + 7);
              puVar55 = puVar42;
              for (uVar47 = uVar44; 3 < (int)uVar47; uVar47 = uVar47 - 3) {
                puVar39[-3] = 0;
                uVar37 = (int)uVar51 + (uint)*puVar55;
                uVar51 = (ulong)uVar37;
                uVar40 = (int)uVar54 + (uint)puVar55[-1];
                uVar54 = (ulong)uVar40;
                uVar6 = *(undefined1 *)(lVar56 + (ulong)(uVar40 & 0x7ff));
                uVar40 = (int)uVar58 + (uint)puVar55[-2];
                uVar58 = (ulong)uVar40;
                uVar7 = *(undefined1 *)(lVar56 + (ulong)(uVar40 & 0x7ff));
                puVar39[-2] = *(undefined1 *)(lVar56 + (ulong)(uVar37 & 0x7ff));
                puVar39[-1] = uVar6;
                *puVar39 = uVar7;
                puVar39 = puVar39 + 4;
                puVar55 = puVar55 + 3;
              }
            }
            else if (uVar47 == 4) {
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *wp;
              auVar63 = auVar63 & auVar32;
              uVar6 = *(undefined1 *)(lVar56 + (ulong)auVar63._4_2_);
              uVar7 = *(undefined1 *)(lVar56 + (ulong)auVar63._2_2_);
              auVar13._10_2_ = 0;
              auVar13._0_10_ = auVar63._0_10_;
              auVar13._12_2_ = auVar63._6_2_;
              auVar19._8_2_ = auVar63._4_2_;
              auVar19._0_8_ = auVar63._0_8_;
              auVar19._10_4_ = auVar13._10_4_;
              auVar27._6_8_ = 0;
              auVar27._0_6_ = auVar19._8_6_;
              auVar64._6_8_ = SUB148(auVar27 << 0x40,6);
              auVar64._4_2_ = auVar63._2_2_;
              auVar64._2_2_ = 0;
              auVar64._0_2_ = auVar63._0_2_;
              auVar64._14_2_ = 0;
              uVar8 = *(undefined1 *)(lVar56 + (ulong)auVar63._0_2_);
              *op = *(undefined1 *)(lVar56 + (ulong)auVar63._6_2_);
              *(undefined1 *)((long)op + 1) = uVar6;
              *(undefined1 *)((long)op + 2) = uVar7;
              *(undefined1 *)((long)op + 3) = uVar8;
              lVar38 = 4;
              for (uVar47 = uVar44; 4 < (int)uVar47; uVar47 = uVar47 - 4) {
                uVar51 = *(ulong *)((long)wp + lVar38 * 2);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar51;
                auVar14._12_2_ = (short)(uVar51 >> 0x30);
                auVar20._8_2_ = (short)(uVar51 >> 0x20);
                auVar20._0_8_ = uVar51;
                auVar20._10_4_ = auVar14._10_4_;
                auVar28._6_8_ = 0;
                auVar28._0_6_ = auVar20._8_6_;
                Var29 = CONCAT82(SUB148(auVar28 << 0x40,6),(short)(uVar51 >> 0x10));
                auVar72._0_4_ = CONCAT22(0,(ushort)uVar51);
                auVar72._4_10_ = Var29;
                auVar72._14_2_ = 0;
                auVar65._0_4_ = auVar64._0_4_ + auVar72._0_4_;
                auVar65._4_4_ = auVar64._4_4_ + (int)Var29;
                auVar65._8_4_ = auVar64._8_4_ + auVar20._8_4_;
                auVar65._12_4_ = auVar64._12_4_ + (auVar14._10_4_ >> 0x10);
                auVar75 = pshuflw(auVar72,auVar65,0xe8);
                auVar75 = pshufhw(auVar75,auVar75,0xe8);
                auVar73._0_4_ = auVar75._0_4_;
                auVar73._8_4_ = auVar75._8_4_;
                auVar73._12_4_ = auVar75._12_4_;
                auVar73._4_4_ = auVar73._8_4_;
                auVar73 = auVar73 & auVar32;
                uVar6 = *(undefined1 *)(lVar56 + (ulong)auVar73._4_2_);
                uVar7 = *(undefined1 *)(lVar56 + (ulong)auVar73._2_2_);
                uVar8 = *(undefined1 *)(lVar56 + (ulong)auVar73._0_2_);
                *(undefined1 *)((long)op + lVar38) = *(undefined1 *)(lVar56 + (ulong)auVar73._6_2_);
                *(undefined1 *)((long)op + lVar38 + 1) = uVar6;
                *(undefined1 *)((long)op + lVar38 + 2) = uVar7;
                *(undefined1 *)((long)op + lVar38 + 3) = uVar8;
                lVar38 = lVar38 + 4;
                auVar64 = auVar65;
              }
            }
            else {
              puVar55 = (ushort *)op;
              puVar43 = wp;
              uVar37 = uVar50 + 1;
              do {
                *(undefined1 *)puVar55 = *(undefined1 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff))
                ;
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = (ushort *)((long)puVar55 + 1);
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  psVar2 = (short *)((long)puVar43 + (ulong)uVar47 * 2);
                  *psVar2 = *psVar2 + (short)*puVar43;
                  *(undefined1 *)puVar55 =
                       *(undefined1 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff));
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = (ushort *)((long)puVar55 + 1);
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        case 2:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          lVar52 = lVar10;
          if ((int)(uint)uVar50 <= (int)uVar44) {
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              *(ushort *)op = (ushort)*wp;
              *(ushort *)((long)op + 2) = *(ushort *)((long)wp + 2);
              uVar50 = *(ushort *)((long)wp + 4);
              *(ushort *)((long)op + 4) = uVar50;
              uVar35 = (ushort)*wp;
              uVar53 = *(ushort *)((long)wp + 2);
              lVar56 = 10;
              for (uVar47 = uVar44; 3 < (int)uVar47; uVar47 = uVar47 - 3) {
                uVar35 = uVar35 + *(short *)((long)wp + lVar56 + -4);
                *(ushort *)((long)op + lVar56 + -4) = uVar35 & 0x7ff;
                uVar53 = uVar53 + *(short *)((long)wp + lVar56 + -2);
                *(ushort *)((long)op + lVar56 + -2) = uVar53 & 0x7ff;
                uVar50 = uVar50 + *(short *)((long)wp + lVar56);
                *(ushort *)((long)op + lVar56) = uVar50 & 0x7ff;
                lVar56 = lVar56 + 6;
              }
            }
            else if (uVar47 == 4) {
              *(ushort *)op = (ushort)*wp;
              *(ushort *)((long)op + 2) = *(ushort *)((long)wp + 2);
              *(ushort *)((long)op + 4) = *(ushort *)((long)wp + 4);
              uVar50 = *(ushort *)((long)wp + 6);
              *(ushort *)((long)op + 6) = uVar50;
              uVar35 = (ushort)*wp;
              uVar53 = *(ushort *)((long)wp + 2);
              uVar46 = *(ushort *)((long)wp + 4);
              lVar56 = 0xe;
              for (uVar47 = uVar44; 4 < (int)uVar47; uVar47 = uVar47 - 4) {
                uVar35 = uVar35 + *(short *)((long)wp + lVar56 + -6);
                *(ushort *)((long)op + lVar56 + -6) = uVar35 & 0x7ff;
                uVar53 = uVar53 + *(short *)((long)wp + lVar56 + -4);
                *(ushort *)((long)op + lVar56 + -4) = uVar53 & 0x7ff;
                uVar46 = uVar46 + *(short *)((long)wp + lVar56 + -2);
                *(ushort *)((long)op + lVar56 + -2) = uVar46 & 0x7ff;
                uVar50 = uVar50 + *(short *)((long)wp + lVar56);
                *(ushort *)((long)op + lVar56) = uVar50 & 0x7ff;
                lVar56 = lVar56 + 8;
              }
            }
            else {
              puVar55 = (ushort *)op;
              puVar43 = wp;
              uVar37 = uVar50 + 1;
              do {
                *puVar55 = (ushort)*puVar43 & 0x7ff;
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = puVar55 + 1;
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  psVar2 = (short *)((long)puVar43 + (ulong)uVar47 * 2);
                  *psVar2 = *psVar2 + (short)*puVar43;
                  *puVar55 = (ushort)*puVar43 & 0x7ff;
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = puVar55 + 1;
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        case 3:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          lVar52 = lVar10;
          if ((int)(uint)uVar50 <= (int)uVar44) {
            lVar56 = *(long *)(puVar9 + 0x120);
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              uVar51 = (ulong)((ushort)*wp & 0x7ff);
              uVar58 = (ulong)(*(ushort *)((long)wp + 2) & 0x7ff);
              uVar54 = (ulong)(*(ushort *)((long)wp + 4) & 0x7ff);
              fVar59 = *(float *)(lVar56 + uVar54 * 4) * 2048.0;
              auVar79._0_4_ = *(float *)(lVar56 + uVar51 * 4) * 2048.0;
              auVar79._4_4_ = *(float *)(lVar56 + uVar58 * 4) * 2048.0;
              auVar79._8_8_ = 0;
              auVar75 = minps(auVar79,auVar34);
              auVar77._0_4_ = (int)auVar75._0_4_;
              auVar77._4_4_ = (int)auVar75._4_4_;
              auVar77._8_4_ = (int)auVar75._8_4_;
              auVar77._12_4_ = (int)auVar75._12_4_;
              auVar75 = pshuflw(auVar77,auVar77,0xe8);
              if (3071.0 <= fVar59) {
                fVar59 = 3071.0;
              }
              *(int *)op = auVar75._0_4_;
              *(ushort *)((long)op + 4) = (ushort)(int)fVar59;
              lVar38 = 10;
              uVar47 = uVar44;
              while (3 < (int)uVar47) {
                uVar47 = uVar47 - 3;
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38 + -4);
                uVar51 = (ulong)uVar37;
                uVar48 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 + -2);
                uVar58 = (ulong)uVar48;
                uVar40 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38);
                uVar54 = (ulong)uVar40;
                fVar59 = *(float *)(lVar56 + (ulong)(uVar40 & 0x7ff) * 4) * 2048.0;
                auVar80._0_4_ = *(float *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 4) * 2048.0;
                auVar80._4_4_ = *(float *)(lVar56 + (ulong)(uVar48 & 0x7ff) * 4) * 2048.0;
                auVar80._8_8_ = 0;
                auVar75 = minps(auVar80,auVar34);
                auVar78._0_4_ = (int)auVar75._0_4_;
                auVar78._4_4_ = (int)auVar75._4_4_;
                auVar78._8_4_ = (int)auVar75._8_4_;
                auVar78._12_4_ = (int)auVar75._12_4_;
                auVar75 = pshuflw(auVar78,auVar78,0xe8);
                *(int *)((long)op + lVar38 + -4) = auVar75._0_4_;
                if (3071.0 <= fVar59) {
                  fVar59 = 3071.0;
                }
                *(short *)((long)op + lVar38) = (short)(int)fVar59;
                lVar38 = lVar38 + 6;
              }
            }
            else if (uVar47 == 4) {
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *wp;
              auVar60 = auVar60 & auVar32;
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar60._0_10_;
              auVar11._12_2_ = auVar60._6_2_;
              auVar17._8_2_ = auVar60._4_2_;
              auVar17._0_8_ = auVar60._0_8_;
              auVar17._10_4_ = auVar11._10_4_;
              auVar25._6_8_ = 0;
              auVar25._0_6_ = auVar17._8_6_;
              auVar23._4_2_ = auVar60._2_2_;
              auVar23._0_4_ = auVar60._0_4_;
              auVar23._6_8_ = SUB148(auVar25 << 0x40,6);
              auVar61._0_4_ = auVar60._0_4_ & 0xffff;
              auVar61._4_10_ = auVar23._4_10_;
              auVar61._14_2_ = 0;
              auVar81._0_4_ = *(float *)(lVar56 + (ulong)auVar60._0_2_ * 4) * 2048.0;
              auVar81._4_4_ = *(float *)(lVar56 + (ulong)auVar60._2_2_ * 4) * 2048.0;
              auVar81._8_4_ = *(float *)(lVar56 + (ulong)auVar60._4_2_ * 4) * 2048.0;
              auVar81._12_4_ = *(float *)(lVar56 + (ulong)auVar60._6_2_ * 4) * 2048.0;
              auVar75 = minps(auVar81,auVar33);
              auVar68._0_4_ = (int)auVar75._0_4_;
              auVar68._4_4_ = (int)auVar75._4_4_;
              auVar68._8_4_ = (int)auVar75._8_4_;
              auVar68._12_4_ = (int)auVar75._12_4_;
              auVar75 = pshuflw(auVar68,auVar68,0xe8);
              auVar75 = pshufhw(auVar75,auVar75,0xe8);
              *(ulong *)op = CONCAT44(auVar75._8_4_,auVar75._0_4_);
              lVar38 = 8;
              uVar47 = uVar44;
              while (4 < (int)uVar47) {
                uVar51 = *(ulong *)((long)wp + lVar38);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar51;
                auVar12._12_2_ = (short)(uVar51 >> 0x30);
                auVar18._8_2_ = (short)(uVar51 >> 0x20);
                auVar18._0_8_ = uVar51;
                auVar18._10_4_ = auVar12._10_4_;
                auVar26._6_8_ = 0;
                auVar26._0_6_ = auVar18._8_6_;
                auVar24._4_2_ = (short)(uVar51 >> 0x10);
                auVar24._0_4_ = (uint)uVar51;
                auVar24._6_8_ = SUB148(auVar26 << 0x40,6);
                auVar69._0_4_ = (uint)uVar51 & 0xffff;
                auVar69._4_10_ = auVar24._4_10_;
                auVar69._14_2_ = 0;
                auVar62._0_4_ = auVar61._0_4_ + auVar69._0_4_;
                auVar62._4_4_ = auVar61._4_4_ + auVar24._4_4_;
                auVar62._8_4_ = auVar61._8_4_ + auVar18._8_4_;
                auVar62._12_4_ = auVar61._12_4_ + (auVar12._10_4_ >> 0x10);
                auVar75 = pshuflw(auVar69,auVar62,0xe8);
                auVar75 = pshufhw(auVar75,auVar75,0xe8);
                auVar70._0_4_ = auVar75._0_4_;
                auVar70._8_4_ = auVar75._8_4_;
                auVar70._12_4_ = auVar75._12_4_;
                auVar70._4_4_ = auVar70._8_4_;
                auVar70 = auVar70 & auVar32;
                uVar47 = uVar47 - 4;
                auVar82._0_4_ = *(float *)(lVar56 + (ulong)auVar70._0_2_ * 4) * 2048.0;
                auVar82._4_4_ = *(float *)(lVar56 + (ulong)auVar70._2_2_ * 4) * 2048.0;
                auVar82._8_4_ = *(float *)(lVar56 + (ulong)auVar70._4_2_ * 4) * 2048.0;
                auVar82._12_4_ = *(float *)(lVar56 + (ulong)auVar70._6_2_ * 4) * 2048.0;
                auVar75 = minps(auVar82,auVar33);
                auVar71._0_4_ = (int)auVar75._0_4_;
                auVar71._4_4_ = (int)auVar75._4_4_;
                auVar71._8_4_ = (int)auVar75._8_4_;
                auVar71._12_4_ = (int)auVar75._12_4_;
                auVar75 = pshuflw(auVar71,auVar71,0xe8);
                auVar75 = pshufhw(auVar75,auVar75,0xe8);
                *(ulong *)((long)op + lVar38) = CONCAT44(auVar75._8_4_,auVar75._0_4_);
                lVar38 = lVar38 + 8;
                auVar61 = auVar62;
              }
            }
            else {
              puVar55 = (ushort *)op;
              puVar43 = wp;
              uVar37 = uVar50 + 1;
              do {
                fVar59 = *(float *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff) * 4) * 2048.0;
                if (3071.0 <= fVar59) {
                  fVar59 = 3071.0;
                }
                *puVar55 = (ushort)(int)fVar59;
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = puVar55 + 1;
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  uVar35 = *(short *)((long)puVar43 + (ulong)uVar47 * 2) + (short)*puVar43;
                  *(ushort *)((long)puVar43 + (ulong)uVar47 * 2) = uVar35;
                  fVar59 = *(float *)(lVar56 + (ulong)(uVar35 & 0x7ff) * 4) * 2048.0;
                  if (3071.0 <= fVar59) {
                    fVar59 = 3071.0;
                  }
                  *puVar55 = (ushort)(int)fVar59;
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = puVar55 + 1;
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        case 4:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          lVar52 = lVar10;
          if ((int)(uint)uVar50 <= (int)uVar44) {
            lVar56 = *(long *)(puVar9 + 0x128);
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              uVar54 = (ulong)((ushort)*wp & 0x7ff);
              *(ushort *)op = *(ushort *)(lVar56 + uVar54 * 2);
              uVar58 = (ulong)(*(ushort *)((long)wp + 2) & 0x7ff);
              *(ushort *)((long)op + 2) = *(ushort *)(lVar56 + uVar58 * 2);
              uVar51 = (ulong)(*(ushort *)((long)wp + 4) & 0x7ff);
              *(ushort *)((long)op + 4) = *(ushort *)(lVar56 + uVar51 * 2);
              lVar38 = 10;
              for (uVar47 = uVar44; 3 < (int)uVar47; uVar47 = uVar47 - 3) {
                uVar37 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38 + -4);
                uVar54 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38 + -4) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                uVar37 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 + -2);
                uVar58 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38 + -2) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38);
                uVar51 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                lVar38 = lVar38 + 6;
              }
            }
            else if (uVar47 == 4) {
              uVar54 = (ulong)((ushort)*wp & 0x7ff);
              *(ushort *)op = *(ushort *)(lVar56 + uVar54 * 2);
              uVar58 = (ulong)(*(ushort *)((long)wp + 2) & 0x7ff);
              *(ushort *)((long)op + 2) = *(ushort *)(lVar56 + uVar58 * 2);
              uVar57 = (ulong)(*(ushort *)((long)wp + 4) & 0x7ff);
              *(ushort *)((long)op + 4) = *(ushort *)(lVar56 + uVar57 * 2);
              uVar51 = (ulong)(*(ushort *)((long)wp + 6) & 0x7ff);
              *(ushort *)((long)op + 6) = *(ushort *)(lVar56 + uVar51 * 2);
              lVar38 = 0xe;
              for (uVar47 = uVar44; 4 < (int)uVar47; uVar47 = uVar47 - 4) {
                uVar37 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38 + -6);
                uVar54 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38 + -6) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                uVar37 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 + -4);
                uVar58 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38 + -4) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                uVar37 = (int)uVar57 + (uint)*(ushort *)((long)wp + lVar38 + -2);
                uVar57 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38 + -2) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38);
                uVar51 = (ulong)uVar37;
                *(undefined2 *)((long)op + lVar38) =
                     *(undefined2 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 2);
                lVar38 = lVar38 + 8;
              }
            }
            else {
              puVar43 = wp;
              puVar55 = (ushort *)op;
              uVar37 = uVar50 + 1;
              do {
                *puVar55 = *(ushort *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff) * 2);
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = puVar55 + 1;
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  psVar2 = (short *)((long)puVar43 + (ulong)uVar47 * 2);
                  *psVar2 = *psVar2 + (short)*puVar43;
                  *puVar55 = *(ushort *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff) * 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = puVar55 + 1;
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        case 5:
          uVar50 = *(ushort *)(puVar9 + 0x100);
          lVar52 = lVar1;
          if ((int)(uint)uVar50 <= (int)uVar44) {
            lVar56 = *(long *)(puVar9 + 0x120);
            uVar47 = (uint)uVar50;
            if (uVar47 == 3) {
              uVar54 = (ulong)((ushort)*wp & 0x7ff);
              uVar58 = (ulong)(*(ushort *)((long)wp + 2) & 0x7ff);
              uVar4 = *(undefined4 *)(lVar56 + uVar58 * 4);
              uVar51 = (ulong)(*(ushort *)((long)wp + 4) & 0x7ff);
              uVar3 = *(undefined4 *)(lVar56 + uVar51 * 4);
              *(undefined4 *)op = *(undefined4 *)(lVar56 + uVar54 * 4);
              *(undefined4 *)((long)op + 4) = uVar4;
              *(undefined4 *)((long)op + 8) = uVar3;
              lVar38 = 10;
              for (uVar47 = uVar44; 3 < (int)uVar47; uVar47 = uVar47 - 3) {
                uVar40 = (int)uVar54 + (uint)*(ushort *)((long)wp + lVar38 + -4);
                uVar54 = (ulong)uVar40;
                uVar37 = (int)uVar58 + (uint)*(ushort *)((long)wp + lVar38 + -2);
                uVar58 = (ulong)uVar37;
                uVar4 = *(undefined4 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 4);
                uVar37 = (int)uVar51 + (uint)*(ushort *)((long)wp + lVar38);
                uVar51 = (ulong)uVar37;
                uVar3 = *(undefined4 *)(lVar56 + (ulong)(uVar37 & 0x7ff) * 4);
                *(undefined4 *)((long)op + (lVar38 + -4) * 2) =
                     *(undefined4 *)(lVar56 + (ulong)(uVar40 & 0x7ff) * 4);
                *(undefined4 *)((long)op + (lVar38 + -2) * 2) = uVar4;
                *(undefined4 *)((long)op + lVar38 * 2) = uVar3;
                lVar38 = lVar38 + 6;
              }
            }
            else if (uVar47 == 4) {
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *wp;
              auVar66 = auVar66 & auVar32;
              uVar3 = *(undefined4 *)(lVar56 + (ulong)auVar66._2_2_ * 4);
              uVar4 = *(undefined4 *)(lVar56 + (ulong)auVar66._4_2_ * 4);
              auVar15._10_2_ = 0;
              auVar15._0_10_ = auVar66._0_10_;
              auVar15._12_2_ = auVar66._6_2_;
              auVar21._8_2_ = auVar66._4_2_;
              auVar21._0_8_ = auVar66._0_8_;
              auVar21._10_4_ = auVar15._10_4_;
              auVar30._6_8_ = 0;
              auVar30._0_6_ = auVar21._8_6_;
              auVar75._6_8_ = SUB148(auVar30 << 0x40,6);
              auVar75._4_2_ = auVar66._2_2_;
              auVar75._2_2_ = 0;
              auVar75._0_2_ = auVar66._0_2_;
              auVar75._14_2_ = 0;
              uVar5 = *(undefined4 *)(lVar56 + (ulong)auVar66._6_2_ * 4);
              *(undefined4 *)op = *(undefined4 *)(lVar56 + (ulong)auVar66._0_2_ * 4);
              *(undefined4 *)((long)op + 4) = uVar3;
              *(undefined4 *)((long)op + 8) = uVar4;
              *(undefined4 *)((long)op + 0xc) = uVar5;
              lVar38 = 8;
              for (uVar47 = uVar44; 4 < (int)uVar47; uVar47 = uVar47 - 4) {
                uVar51 = *(ulong *)((long)wp + lVar38);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar51;
                auVar16._12_2_ = (short)(uVar51 >> 0x30);
                auVar22._8_2_ = (short)(uVar51 >> 0x20);
                auVar22._0_8_ = uVar51;
                auVar22._10_4_ = auVar16._10_4_;
                auVar31._6_8_ = 0;
                auVar31._0_6_ = auVar22._8_6_;
                Var29 = CONCAT82(SUB148(auVar31 << 0x40,6),(short)(uVar51 >> 0x10));
                auVar74._0_4_ = CONCAT22(0,(ushort)uVar51);
                auVar74._4_10_ = Var29;
                auVar74._14_2_ = 0;
                auVar67._0_4_ = auVar75._0_4_ + auVar74._0_4_;
                auVar67._4_4_ = auVar75._4_4_ + (int)Var29;
                auVar67._8_4_ = auVar75._8_4_ + auVar22._8_4_;
                auVar67._12_4_ = auVar75._12_4_ + (auVar16._10_4_ >> 0x10);
                auVar75 = pshuflw(auVar74,auVar67,0xe8);
                auVar75 = pshufhw(auVar75,auVar75,0xe8);
                auVar76._0_4_ = auVar75._0_4_;
                auVar76._8_4_ = auVar75._8_4_;
                auVar76._12_4_ = auVar75._12_4_;
                auVar76._4_4_ = auVar76._8_4_;
                auVar76 = auVar76 & auVar32;
                uVar3 = *(undefined4 *)(lVar56 + (ulong)auVar76._2_2_ * 4);
                uVar4 = *(undefined4 *)(lVar56 + (ulong)auVar76._4_2_ * 4);
                uVar5 = *(undefined4 *)(lVar56 + (ulong)auVar76._6_2_ * 4);
                *(undefined4 *)((long)op + lVar38 * 2) =
                     *(undefined4 *)(lVar56 + (ulong)auVar76._0_2_ * 4);
                *(undefined4 *)((long)op + (lVar38 + 2) * 2) = uVar3;
                *(undefined4 *)((long)op + (lVar38 + 4) * 2) = uVar4;
                *(undefined4 *)((long)op + (lVar38 + 6) * 2) = uVar5;
                lVar38 = lVar38 + 8;
                auVar75 = auVar67;
              }
            }
            else {
              puVar43 = wp;
              puVar55 = (ushort *)op;
              uVar37 = uVar50 + 1;
              do {
                *(undefined4 *)puVar55 =
                     *(undefined4 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff) * 4);
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar55 = puVar55 + 2;
                uVar37 = uVar37 - 1;
              } while (1 < uVar37);
              uVar37 = uVar44;
              while (uVar48 = uVar37 - uVar50, uVar40 = uVar50 + 1,
                    uVar48 != 0 && (int)(uint)uVar50 <= (int)uVar37) {
                do {
                  psVar2 = (short *)((long)puVar43 + (ulong)uVar47 * 2);
                  *psVar2 = *psVar2 + (short)*puVar43;
                  *(undefined4 *)puVar55 =
                       *(undefined4 *)(lVar56 + (ulong)((ushort)*puVar43 & 0x7ff) * 4);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar55 = puVar55 + 2;
                  uVar40 = uVar40 - 1;
                  uVar37 = uVar48;
                } while (1 < (int)uVar40);
              }
            }
          }
          break;
        default:
          uVar50 = (tif->tif_dir).td_bitspersample;
          pcVar41 = "Unsupported bits/sample: %u";
          goto LAB_0026784a;
        }
        op = (uint8_t *)((long)op + lVar52);
        lVar45 = lVar45 + lVar49;
        wp = (ulong *)((long)wp + lVar10);
        puVar42 = puVar42 + lVar49;
      } while( true );
    }
    pcVar41 = "sp->stream.avail_out > sp->tbuf_size";
  }
  else {
    pcVar41 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogDecode",pcVar41);
  return 0;
}

Assistant:

static int PixarLogDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PixarLogDecode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = DecoderState(tif);
    tmsize_t i;
    tmsize_t nsamples;
    int llen;
    uint16_t *up;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            nsamples = occ / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            nsamples = occ / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            nsamples = occ;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;

    (void)s;
    assert(sp != NULL);

    sp->stream.next_in = tif->tif_rawcp;
    sp->stream.avail_in = (uInt)tif->tif_rawcc;

    sp->stream.next_out = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_out) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_out = (uInt)(nsamples * sizeof(uint16_t));
    if (sp->stream.avail_out != nsamples * sizeof(uint16_t))
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }
    /* Check that we will not fill more than what was allocated */
    if ((tmsize_t)sp->stream.avail_out > sp->tbuf_size)
    {
        TIFFErrorExtR(tif, module, "sp->stream.avail_out > sp->tbuf_size");
        return (0);
    }
    do
    {
        int state = inflate(&sp->stream, Z_PARTIAL_FLUSH);
        if (state == Z_STREAM_END)
        {
            break; /* XXX */
        }
        if (state == Z_DATA_ERROR)
        {
            TIFFErrorExtR(
                tif, module, "Decoding error at scanline %" PRIu32 ", %s",
                tif->tif_row, sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (state != Z_OK)
        {
            TIFFErrorExtR(tif, module, "ZLib error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
    } while (sp->stream.avail_out > 0);

    /* hopefully, we got all the bytes we needed */
    if (sp->stream.avail_out != 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32
                      " (short %u bytes)",
                      tif->tif_row, sp->stream.avail_out);
        return (0);
    }

    tif->tif_rawcp = sp->stream.next_in;
    tif->tif_rawcc = sp->stream.avail_in;

    up = sp->tbuf;
    /* Swap bytes in the data if from a different endian machine. */
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfShort(up, nsamples);

    /*
     * if llen is not an exact multiple of nsamples, the decode operation
     * may overflow the output buffer, so truncate it enough to prevent
     * that but still salvage as much data as possible.
     */
    if (nsamples % llen)
    {
        TIFFWarningExtR(tif, module,
                        "stride %d is not a multiple of sample count, "
                        "%" TIFF_SSIZE_FORMAT ", data truncated.",
                        llen, nsamples);
        nsamples -= nsamples % llen;
    }

    for (i = 0; i < nsamples; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalAccumulateF(up, llen, sp->stride, (float *)op,
                                      sp->ToLinearF);
                op += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalAccumulate16(up, llen, sp->stride, (uint16_t *)op,
                                       sp->ToLinear16);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_12BITPICIO:
                horizontalAccumulate12(up, llen, sp->stride, (int16_t *)op,
                                       sp->ToLinearF);
                op += llen * sizeof(int16_t);
                break;
            case PIXARLOGDATAFMT_11BITLOG:
                horizontalAccumulate11(up, llen, sp->stride, (uint16_t *)op);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalAccumulate8(up, llen, sp->stride, (unsigned char *)op,
                                      sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            case PIXARLOGDATAFMT_8BITABGR:
                horizontalAccumulate8abgr(up, llen, sp->stride,
                                          (unsigned char *)op, sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module, "Unsupported bits/sample: %" PRIu16,
                              td->td_bitspersample);
                return (0);
        }
    }

    return (1);
}